

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse4.c
# Opt level: O0

uint aom_highbd_10_variance4x4_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  long lVar1;
  uint *in_R8;
  uint64_t local_sse;
  int64_t diff;
  int64_t sum;
  int64_t *in_stack_00000098;
  uint64_t *in_stack_000000a0;
  int in_stack_000000ac;
  uint8_t *in_stack_000000b0;
  int in_stack_000000bc;
  uint8_t *in_stack_000000c0;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_30;
  
  variance4x4_64_sse4_1
            (in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000ac,
             in_stack_000000a0,in_stack_00000098);
  *in_R8 = (uint)(local_40 + 8U >> 4);
  lVar1 = local_30 + 2 >> 2;
  lVar1 = (ulong)*in_R8 - (lVar1 * lVar1 >> 4);
  if (lVar1 < 0) {
    local_44 = 0;
  }
  else {
    local_44 = (uint)lVar1;
  }
  return local_44;
}

Assistant:

uint32_t aom_highbd_10_variance4x4_sse4_1(const uint8_t *a, int a_stride,
                                          const uint8_t *b, int b_stride,
                                          uint32_t *sse) {
  int64_t sum, diff;
  uint64_t local_sse;

  variance4x4_64_sse4_1(a, a_stride, b, b_stride, &local_sse, &sum);
  *sse = (uint32_t)ROUND_POWER_OF_TWO(local_sse, 4);
  sum = ROUND_POWER_OF_TWO(sum, 2);

  diff = (int64_t)*sse - ((sum * sum) >> 4);
  return (diff >= 0) ? (uint32_t)diff : 0;
}